

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O2

void __thiscall
front::symbol::ArraySymbol::ArraySymbol
          (ArraySymbol *this,string *name,SharedSyPtr *item,int layer_num,bool is_const,
          bool is_param)

{
  int iVar1;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,(string *)name);
  Symbol::Symbol(&this->super_Symbol,&local_50,layer_num);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_Symbol)._vptr_Symbol = (_func_int **)&PTR_kind_001dab68;
  std::__shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>,
             &item->super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>);
  this->_is_const = is_const;
  this->_is_param = is_param;
  (this->_dimensions).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_dimensions).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_dimensions).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_values).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_values).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_values).
  super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_size = -1;
  iVar1 = Symbol::symbolId + 1;
  (this->super_Symbol).id = Symbol::symbolId;
  Symbol::symbolId = iVar1;
  return;
}

Assistant:

ArraySymbol(string name, SharedSyPtr item, int layer_num, bool is_const,
              bool is_param)
      : _item(item), _is_const(is_const), _is_param(is_param),
        Symbol(name, layer_num) {
    _size = -1;
    id = Symbol::symbolId++;
  }